

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O3

void __thiscall cfd::core::Psbt::SetTxOutData(Psbt *this,uint32_t index,KeyData *key)

{
  long lVar1;
  Psbt *this_00;
  bool bVar2;
  CfdException *this_01;
  undefined4 in_register_00000034;
  pointer this_02;
  Script wpkh_script;
  Pubkey pubkey;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> arr;
  Script redeem_script;
  Script locking_script;
  Script script;
  Script local_190;
  Pubkey local_158;
  KeyData *local_140;
  Psbt *local_138;
  void *local_130;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_128;
  Script local_110;
  Script local_d8;
  Script local_a0;
  Script local_68;
  
  (*this->_vptr_Psbt[3])(this,CONCAT44(in_register_00000034,index),0xb61,"SetTxOutData");
  local_130 = this->wally_psbt_pointer_;
  local_138 = this;
  GetTxOutKeyDataList(&local_128,this,index);
  local_140 = key;
  KeyData::GetPubkey(&local_158,key);
  if (local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this_02 = local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      KeyData::GetPubkey((Pubkey *)&local_d8,this_02);
      bVar2 = Pubkey::Equals(&local_158,(Pubkey *)&local_d8);
      if (local_d8._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_d8._vptr_Script);
      }
      if (bVar2) goto LAB_001ca9f1;
      this_02 = this_02 + 1;
    } while (this_02 !=
             local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  lVar1 = *(long *)(*(long *)((long)local_130 + 8) + 0x20);
  ByteData::ByteData((ByteData *)&local_110,*(uint8_t **)(lVar1 + 8 + (ulong)index * 0x70),
                     *(uint32_t *)(lVar1 + 0x10 + (ulong)index * 0x70));
  Script::Script(&local_d8,(ByteData *)&local_110);
  this_00 = local_138;
  if (local_110._vptr_Script != (_func_int **)0x0) {
    operator_delete(local_110._vptr_Script);
  }
  Script::Script(&local_110);
  Script::Script(&local_a0);
  bVar2 = Script::IsP2pkhScript(&local_d8);
  if (bVar2) {
    ScriptUtil::CreateP2pkhLockingScript(&local_190,&local_158);
    Script::operator=(&local_a0,&local_190);
  }
  else {
    bVar2 = Script::IsP2wpkhScript(&local_d8);
    if (bVar2) {
      ScriptUtil::CreateP2wpkhLockingScript(&local_190,&local_158);
      Script::operator=(&local_a0,&local_190);
    }
    else {
      bVar2 = Script::IsP2shScript(&local_d8);
      if (!bVar2) goto LAB_001ca93f;
      ScriptUtil::CreateP2wpkhLockingScript(&local_190,&local_158);
      ScriptUtil::CreateP2shLockingScript(&local_68,&local_190);
      Script::operator=(&local_a0,&local_68);
      Script::~Script(&local_68);
      Script::operator=(&local_110,&local_190);
    }
  }
  Script::~Script(&local_190);
LAB_001ca93f:
  bVar2 = Script::Equals(&local_d8,&local_a0);
  if (!bVar2) {
    local_190._vptr_Script = (_func_int **)0x21c1d0;
    local_190.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xb7b;
    local_190.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = "SetTxOutData";
    logger::log<>((CfdSourceLocation *)&local_190,kCfdLogLevelWarning,"unmatch pubkey.");
    this_01 = (CfdException *)__cxa_allocate_exception(0x30);
    local_190._vptr_Script =
         (_func_int **)
         &local_190.script_data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_190,"psbt unmatch pubkey error.","");
    CfdException::CfdException(this_01,kCfdIllegalArgumentError,(string *)&local_190);
    __cxa_throw(this_01,&CfdException::typeinfo,CfdException::~CfdException);
  }
  GetTxOutScript(&local_190,this_00,index,true,(bool *)0x0);
  bVar2 = Script::IsEmpty(&local_190);
  Script::~Script(&local_190);
  if (!bVar2) {
    Script::Script(&local_190);
    Script::operator=(&local_110,&local_190);
    Script::~Script(&local_190);
  }
  SetTxOutData(this_00,index,&local_110,local_140);
  Script::~Script(&local_a0);
  Script::~Script(&local_110);
  Script::~Script(&local_d8);
LAB_001ca9f1:
  if (local_158.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_128);
  return;
}

Assistant:

void Psbt::SetTxOutData(uint32_t index, const KeyData &key) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);

  std::vector<KeyData> arr = GetTxOutKeyDataList(index);
  Pubkey pubkey = key.GetPubkey();
  for (auto &item : arr) {
    if (pubkey.Equals(item.GetPubkey())) return;
  }

  struct wally_tx_output *txout = &psbt_pointer->tx->outputs[index];
  Script locking_script(
      ByteData(txout->script, static_cast<uint32_t>(txout->script_len)));
  Script redeem_script;
  Script script;

  if (locking_script.IsP2pkhScript()) {
    script = ScriptUtil::CreateP2pkhLockingScript(pubkey);
  } else if (locking_script.IsP2wpkhScript()) {
    script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
  } else if (locking_script.IsP2shScript()) {
    auto wpkh_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey);
    script = ScriptUtil::CreateP2shLockingScript(wpkh_script);
    redeem_script = wpkh_script;
  }
  if (!locking_script.Equals(script)) {
    warn(CFD_LOG_SOURCE, "unmatch pubkey.");
    throw CfdException(kCfdIllegalArgumentError, "psbt unmatch pubkey error.");
  }

  if (!GetTxOutScript(index, true).IsEmpty()) redeem_script = Script();
  SetTxOutData(index, redeem_script, key);
}